

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O0

int stb_vorbis_decode_frame_pushdata
              (stb_vorbis *f,uint8 *data,int data_len,int *channels,float ***output,int *samples)

{
  int iVar1;
  uint uVar2;
  vorb *in_RCX;
  int in_EDX;
  uint8 *in_RSI;
  vorb *in_RDI;
  long *in_R8;
  stb_vorbis *in_R9;
  STBVorbisError error;
  int left;
  int right;
  int len;
  int i;
  undefined4 in_stack_ffffffffffffffb0;
  undefined4 uVar3;
  STBVorbisError SVar4;
  int local_48;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc4;
  int local_4;
  
  if (in_RDI->push_mode == '\0') {
    local_4 = ::error(in_RDI,VORBIS_invalid_api_mixing);
  }
  else if (in_RDI->page_crc_tests < 0) {
    in_RDI->stream = in_RSI;
    in_RDI->stream_end = in_RSI + in_EDX;
    in_RDI->error = VORBIS__no_error;
    iVar1 = is_whole_packet_present(in_R9);
    if (iVar1 == 0) {
      in_R9->sample_rate = 0;
      local_4 = 0;
    }
    else {
      iVar1 = vorbis_decode_packet
                        (in_RCX,(int *)in_R8,(int *)in_R9,
                         (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
      local_4 = (int)in_RSI;
      if (iVar1 == 0) {
        SVar4 = in_RDI->error;
        if (SVar4 == VORBIS_bad_packet_type) {
          in_RDI->error = VORBIS__no_error;
          uVar3 = 0x23;
          do {
            iVar1 = get8_packet((vorb *)CONCAT44(uVar3,in_stack_ffffffffffffffb0));
            if (iVar1 == -1) break;
          } while (in_RDI->eof == 0);
          in_R9->sample_rate = 0;
          local_4 = (int)in_RDI->stream - local_4;
        }
        else if ((SVar4 == VORBIS_continued_packet_flag_invalid) && (in_RDI->previous_length == 0))
        {
          in_RDI->error = VORBIS__no_error;
          uVar3 = 0x20;
          do {
            iVar1 = get8_packet((vorb *)CONCAT44(uVar3,in_stack_ffffffffffffffb0));
            if (iVar1 == -1) break;
          } while (in_RDI->eof == 0);
          in_R9->sample_rate = 0;
          local_4 = (int)in_RDI->stream - local_4;
        }
        else {
          stb_vorbis_flush_pushdata(in_RDI);
          in_RDI->error = SVar4;
          in_R9->sample_rate = 0;
          local_4 = 1;
        }
      }
      else {
        uVar2 = vorbis_finish_frame(in_RCX,(int)((ulong)in_R8 >> 0x20),(int)in_R8,
                                    (int)((ulong)in_R9 >> 0x20));
        for (iVar1 = 0; iVar1 < in_RDI->channels; iVar1 = iVar1 + 1) {
          in_RDI->outputs[iVar1] = in_RDI->channel_buffers[iVar1] + local_48;
        }
        if (in_RCX != (stb_vorbis *)0x0) {
          in_RCX->sample_rate = in_RDI->channels;
        }
        in_R9->sample_rate = uVar2;
        *in_R8 = (long)in_RDI->outputs;
        local_4 = (int)in_RDI->stream - local_4;
      }
    }
  }
  else {
    in_R9->sample_rate = 0;
    local_4 = vorbis_search_for_page_pushdata(in_RCX,(uint8 *)in_R8,(int)((ulong)in_R9 >> 0x20));
  }
  return local_4;
}

Assistant:

int stb_vorbis_decode_frame_pushdata(
         stb_vorbis *f,                   // the file we're decoding
         const uint8 *data, int data_len, // the memory available for decoding
         int *channels,                   // place to write number of float * buffers
         float ***output,                 // place to write float ** array of float * buffers
         int *samples                     // place to write number of output samples
     )
{
   int i;
   int len,right,left;

   if (!IS_PUSH_MODE(f)) return error(f, VORBIS_invalid_api_mixing);

   if (f->page_crc_tests >= 0) {
      *samples = 0;
      return vorbis_search_for_page_pushdata(f, (uint8 *) data, data_len);
   }

   f->stream     = (uint8 *) data;
   f->stream_end = (uint8 *) data + data_len;
   f->error      = VORBIS__no_error;

   // check that we have the entire packet in memory
   if (!is_whole_packet_present(f)) {
      *samples = 0;
      return 0;
   }

   if (!vorbis_decode_packet(f, &len, &left, &right)) {
      // save the actual error we encountered
      enum STBVorbisError error = f->error;
      if (error == VORBIS_bad_packet_type) {
         // flush and resynch
         f->error = VORBIS__no_error;
         while (get8_packet(f) != EOP)
            if (f->eof) break;
         *samples = 0;
         return (int) (f->stream - data);
      }
      if (error == VORBIS_continued_packet_flag_invalid) {
         if (f->previous_length == 0) {
            // we may be resynching, in which case it's ok to hit one
            // of these; just discard the packet
            f->error = VORBIS__no_error;
            while (get8_packet(f) != EOP)
               if (f->eof) break;
            *samples = 0;
            return (int) (f->stream - data);
         }
      }
      // if we get an error while parsing, what to do?
      // well, it DEFINITELY won't work to continue from where we are!
      stb_vorbis_flush_pushdata(f);
      // restore the error that actually made us bail
      f->error = error;
      *samples = 0;
      return 1;
   }

   // success!
   len = vorbis_finish_frame(f, len, left, right);
   for (i=0; i < f->channels; ++i)
      f->outputs[i] = f->channel_buffers[i] + left;

   if (channels) *channels = f->channels;
   *samples = len;
   *output = f->outputs;
   return (int) (f->stream - data);
}